

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDFileBase.cpp
# Opt level: O2

char * fix_to_utf8(char *s,char **arena,char *arena_end)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  byte *pbVar4;
  
  pvVar3 = utf8valid(s);
  if (pvVar3 != (void *)0x0) {
    pbVar2 = (byte *)*arena;
    pbVar4 = pbVar2;
    while( true ) {
      bVar1 = *s;
      if (bVar1 == 0) break;
      if ((char)bVar1 < '\0') {
        if (arena_end <= pbVar4 + 2) goto LAB_00120c45;
        *pbVar4 = bVar1 >> 6 | 0xc0;
        pbVar4[1] = bVar1 & 0xbf;
        pbVar4 = pbVar4 + 2;
      }
      else {
        if (arena_end <= pbVar4 + 1) goto LAB_00120c45;
        *pbVar4 = bVar1;
        pbVar4 = pbVar4 + 1;
      }
      s = (char *)((byte *)s + 1);
    }
    if (pbVar4 + 1 < arena_end) {
      *pbVar4 = 0;
      pbVar4 = pbVar4 + 1;
    }
LAB_00120c45:
    *arena = (char *)pbVar4;
    s = (char *)pbVar2;
  }
  return s;
}

Assistant:

char *fix_to_utf8(char *s, char **arena, char *arena_end) {
	if (!utf8valid(s)) {
		return s;
	}
	char *p     = *arena;
	char *begin = p;
	while (*s) {
		uint32_t c = (uint8_t)*s;
		if (c < 0x80) {
			if (p + 1 >= arena_end) goto done;
			*p++ = c;
		} else {
			if (p + 2 >= arena_end) goto done;
			*p++ = 0xc0 | (c >> 6);
			*p++ = 0x80 | (c & 0x3f);
		}
		++s;
	}
	if (p + 1 >= arena_end) goto done;
	*p++ = 0;
done:
	*arena = p;
	return begin;
}